

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O0

TestCaseGroup * vkt::SpirVAssembly::createOpSourceTests(TestContext *testCtx)

{
  undefined1 *inputColors;
  string *psVar1;
  NameCodePair *pNVar2;
  long lVar3;
  TestCaseGroup *pTVar4;
  mapped_type *this;
  size_t num4ByteChars;
  NameCodePair *local_588;
  RGBA *local_3e8;
  string local_3e0;
  allocator<char> local_3b9;
  key_type local_3b8;
  ulong local_398;
  size_t testNdx;
  string local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  allocator<char> local_305;
  allocator<char> local_304;
  allocator<char> local_303;
  undefined1 local_302;
  allocator<char> local_301;
  allocator<char> local_300;
  undefined1 local_2ff;
  allocator<char> local_2fe;
  allocator<char> local_2fd;
  undefined1 local_2fc;
  allocator<char> local_2fb;
  allocator<char> local_2fa;
  undefined1 local_2f9;
  allocator<char> local_2f8;
  allocator<char> local_2f7;
  undefined1 local_2f6;
  allocator<char> local_2f5;
  allocator<char> local_2f4;
  undefined1 local_2f3;
  allocator<char> local_2f2;
  allocator<char> local_2f1;
  string *local_2f0;
  undefined1 local_2e8 [8];
  NameCodePair tests [9];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fragments;
  undefined1 local_68 [8];
  string opsourceGLSLWithFile;
  undefined1 local_38 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> opSourceTests;
  RGBA defaultColors [4];
  TestContext *testCtx_local;
  
  local_3e8 = (RGBA *)&opSourceTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data.field_0x8;
  defaultColors._8_8_ = testCtx;
  do {
    tcu::RGBA::RGBA(local_3e8);
    local_3e8 = local_3e8 + 1;
  } while (local_3e8 != defaultColors + 2);
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(TestContext *)defaultColors._8_8_,"opsource","OpSource instruction");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)(opsourceGLSLWithFile.field_2._M_local_buf + 0xb)
            );
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_38,pTVar4
            );
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_68,"%opsrcfile = OpString \"foo.vert\"\nOpSource GLSL 450 %opsrcfile ",
             (allocator<char> *)
             ((long)&fragments._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&fragments._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  passthruFragments_abi_cxx11_();
  testNdx._6_1_ = 1;
  local_2f0 = (string *)local_2e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_2e8,"unknown",&local_2f1);
  local_2f3 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(tests[0].name.field_2._M_local_buf + 8),"OpSource Unknown 321",&local_2f2);
  local_2f3 = 0;
  psVar1 = (string *)(tests[0].code.field_2._M_local_buf + 8);
  local_2f0 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"essl",&local_2f4);
  local_2f6 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(tests[1].name.field_2._M_local_buf + 8),"OpSource ESSL 310",&local_2f5);
  local_2f6 = 0;
  psVar1 = (string *)(tests[1].code.field_2._M_local_buf + 8);
  local_2f0 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"glsl",&local_2f7);
  local_2f9 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(tests[2].name.field_2._M_local_buf + 8),"OpSource GLSL 450",&local_2f8);
  local_2f9 = 0;
  psVar1 = (string *)(tests[2].code.field_2._M_local_buf + 8);
  local_2f0 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"opencl_cpp",&local_2fa);
  local_2fc = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(tests[3].name.field_2._M_local_buf + 8),"OpSource OpenCL_CPP 120",&local_2fb
            );
  local_2fc = 0;
  psVar1 = (string *)(tests[3].code.field_2._M_local_buf + 8);
  local_2f0 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"opencl_c",&local_2fd);
  local_2ff = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(tests[4].name.field_2._M_local_buf + 8),"OpSource OpenCL_C 120",&local_2fe);
  local_2ff = 0;
  psVar1 = (string *)(tests[4].code.field_2._M_local_buf + 8);
  local_2f0 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"multiple",&local_300);
  local_302 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(tests[5].name.field_2._M_local_buf + 8),
             "OpSource GLSL 450\nOpSource GLSL 450",&local_301);
  local_302 = 0;
  psVar1 = (string *)(tests[5].code.field_2._M_local_buf + 8);
  local_2f0 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"file",&local_303);
  std::__cxx11::string::string
            ((string *)(tests[6].name.field_2._M_local_buf + 8),(string *)local_68);
  psVar1 = (string *)(tests[6].code.field_2._M_local_buf + 8);
  local_2f0 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"source",&local_304);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&tests[7].name.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                 "\"void main(){}\"");
  psVar1 = (string *)(tests[7].code.field_2._M_local_buf + 8);
  local_2f0 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"longsource",&local_305);
  testNdx._7_1_ = 1;
  std::operator+(&local_368,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,'\"')
  ;
  (anonymous_namespace)::makeLongUTF8String_abi_cxx11_
            (&local_388,(_anonymous_namespace_ *)0xfffa,num4ByteChars);
  std::operator+(&local_348,&local_368,&local_388);
  std::operator+(&local_328,&local_348,"ccc");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&tests[8].name.field_2 + 8),&local_328,'\"');
  testNdx._7_1_ = 0;
  testNdx._6_1_ = 0;
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)&local_368);
  std::allocator<char>::~allocator(&local_305);
  std::allocator<char>::~allocator(&local_304);
  std::allocator<char>::~allocator(&local_303);
  std::allocator<char>::~allocator(&local_301);
  std::allocator<char>::~allocator(&local_300);
  std::allocator<char>::~allocator(&local_2fe);
  std::allocator<char>::~allocator(&local_2fd);
  std::allocator<char>::~allocator(&local_2fb);
  std::allocator<char>::~allocator(&local_2fa);
  std::allocator<char>::~allocator(&local_2f8);
  std::allocator<char>::~allocator(&local_2f7);
  std::allocator<char>::~allocator(&local_2f5);
  std::allocator<char>::~allocator(&local_2f4);
  std::allocator<char>::~allocator(&local_2f2);
  std::allocator<char>::~allocator(&local_2f1);
  getDefaultColors((RGBA (*) [4])
                   &opSourceTests.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data.field_0x8);
  for (local_398 = 0; local_398 < 9; local_398 = local_398 + 1) {
    pNVar2 = tests + local_398;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8,"debug",&local_3b9);
    this = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&stack0xffffffffffffff60,&local_3b8);
    std::__cxx11::string::operator=
              ((string *)this,(string *)((pNVar2->name).field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_3b8);
    std::allocator<char>::~allocator(&local_3b9);
    lVar3 = local_398 - 1;
    pTVar4 = de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
             get((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_38
                );
    std::__cxx11::string::string((string *)&local_3e0);
    inputColors = &opSourceTests.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                   m_data.field_0x8;
    createTestsForAllStages
              ((string *)((long)&tests[lVar3].code.field_2 + 8),(RGBA (*) [4])inputColors,
               (RGBA (*) [4])inputColors,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&stack0xffffffffffffff60,pTVar4,QP_TEST_RESULT_FAIL,&local_3e0);
    std::__cxx11::string::~string((string *)&local_3e0);
  }
  pTVar4 = de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
           release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_38)
  ;
  local_588 = (NameCodePair *)((long)&tests[8].code.field_2 + 8);
  do {
    local_588 = local_588 + -1;
    createOpSourceTests::NameCodePair::~NameCodePair(local_588);
  } while (local_588 != (NameCodePair *)local_2e8);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)&stack0xffffffffffffff60);
  std::__cxx11::string::~string((string *)local_68);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_38);
  return pTVar4;
}

Assistant:

tcu::TestCaseGroup* createOpSourceTests (tcu::TestContext& testCtx)
{
	struct NameCodePair { string name, code; };
	RGBA							defaultColors[4];
	de::MovePtr<tcu::TestCaseGroup> opSourceTests			(new tcu::TestCaseGroup(testCtx, "opsource", "OpSource instruction"));
	const std::string				opsourceGLSLWithFile	= "%opsrcfile = OpString \"foo.vert\"\nOpSource GLSL 450 %opsrcfile ";
	map<string, string>				fragments				= passthruFragments();
	const NameCodePair				tests[]					=
	{
		{"unknown", "OpSource Unknown 321"},
		{"essl", "OpSource ESSL 310"},
		{"glsl", "OpSource GLSL 450"},
		{"opencl_cpp", "OpSource OpenCL_CPP 120"},
		{"opencl_c", "OpSource OpenCL_C 120"},
		{"multiple", "OpSource GLSL 450\nOpSource GLSL 450"},
		{"file", opsourceGLSLWithFile},
		{"source", opsourceGLSLWithFile + "\"void main(){}\""},
		// Longest possible source string: SPIR-V limits instructions to 65535
		// words, of which the first 4 are opsourceGLSLWithFile; the rest will
		// contain 65530 UTF8 characters (one word each) plus one last word
		// containing 3 ASCII characters and \0.
		{"longsource", opsourceGLSLWithFile + '"' + makeLongUTF8String(65530) + "ccc" + '"'}
	};

	getDefaultColors(defaultColors);
	for (size_t testNdx = 0; testNdx < sizeof(tests) / sizeof(NameCodePair); ++testNdx)
	{
		fragments["debug"] = tests[testNdx].code;
		createTestsForAllStages(tests[testNdx].name, defaultColors, defaultColors, fragments, opSourceTests.get());
	}

	return opSourceTests.release();
}